

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

PaError Pa_Initialize(void)

{
  int iVar1;
  uint uVar2;
  PaUtilHostApiInitializer *pPVar3;
  PaUtilHostApiRepresentation *pPVar4;
  PaError PVar5;
  PaUtilHostApiRepresentation **ppPVar6;
  PaUtilHostApiInitializer **ppPVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  if (initializationCount_ == 0) {
    PaUtil_InitializeClock();
    uVar13 = 0xffffffffffffffff;
    lVar10 = -0x100000000;
    ppPVar7 = paHostApiInitializers;
    do {
      lVar10 = lVar10 + 0x100000000;
      uVar12 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar12;
      pPVar3 = *ppPVar7;
      ppPVar7 = ppPVar7 + 1;
    } while (pPVar3 != (PaUtilHostApiInitializer *)0x0);
    ppPVar6 = (PaUtilHostApiRepresentation **)PaUtil_AllocateMemory(lVar10 >> 0x1d);
    hostApis_ = ppPVar6;
    if (ppPVar6 == (PaUtilHostApiRepresentation **)0x0) {
      PVar5 = -0x2708;
LAB_001086c1:
      TerminateHostApis();
      return PVar5;
    }
    hostApisCount_ = 0;
    defaultHostApiIndex_ = -1;
    deviceCount_ = 0;
    uVar8 = 0;
    if ((int)uVar12 < 1) {
      uVar13 = uVar8;
    }
    iVar9 = 0;
    for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
      ppPVar6[(int)uVar8] = (PaUtilHostApiRepresentation *)0x0;
      PVar5 = (*paHostApiInitializers[uVar11])(ppPVar6 + (int)uVar8,(int)uVar8);
      ppPVar6 = hostApis_;
      if (PVar5 != 0) goto LAB_001086c1;
      uVar8 = (ulong)hostApisCount_;
      pPVar4 = hostApis_[uVar8];
      if (pPVar4 != (PaUtilHostApiRepresentation *)0x0) {
        iVar1 = (pPVar4->info).deviceCount;
        uVar12 = (pPVar4->info).defaultInputDevice;
        if (iVar1 <= (int)uVar12) {
          __assert_fail("hostApi->info.defaultInputDevice < hostApi->info.deviceCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/common/pa_front.c"
                        ,0xeb,"PaError InitializeHostApis(void)");
        }
        uVar2 = (pPVar4->info).defaultOutputDevice;
        if (iVar1 <= (int)uVar2) {
          __assert_fail("hostApi->info.defaultOutputDevice < hostApi->info.deviceCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/common/pa_front.c"
                        ,0xec,"PaError InitializeHostApis(void)");
        }
        if (defaultHostApiIndex_ == -1) {
          if ((uVar2 & uVar12) != 0xffffffff) {
            defaultHostApiIndex_ = hostApisCount_;
            goto LAB_00108666;
          }
          (pPVar4->privatePaFrontInfo).baseDeviceIndex = (long)iVar9;
        }
        else {
LAB_00108666:
          (pPVar4->privatePaFrontInfo).baseDeviceIndex = (long)iVar9;
          if (uVar12 != 0xffffffff) {
            (pPVar4->info).defaultInputDevice = uVar12 + iVar9;
          }
          if (uVar2 != 0xffffffff) {
            (pPVar4->info).defaultOutputDevice = uVar2 + iVar9;
          }
        }
        deviceCount_ = deviceCount_ + iVar1;
        iVar9 = iVar9 + iVar1;
        hostApisCount_ = hostApisCount_ + 1;
        uVar8 = (ulong)(uint)hostApisCount_;
      }
    }
    if (defaultHostApiIndex_ == -1) {
      defaultHostApiIndex_ = 0;
    }
    initializationCount_ = initializationCount_ + 1;
  }
  else {
    initializationCount_ = initializationCount_ + 1;
  }
  return 0;
}

Assistant:

PaError Pa_Initialize( void )
{
    PaError result;

    PA_LOGAPI_ENTER( "Pa_Initialize" );

    if( PA_IS_INITIALISED_ )
    {
        ++initializationCount_;
        result = paNoError;
    }
    else
    {
        PA_VALIDATE_TYPE_SIZES;
        PA_VALIDATE_ENDIANNESS;

        PaUtil_InitializeClock();
        PaUtil_ResetTraceMessages();

        result = InitializeHostApis();
        if( result == paNoError )
            ++initializationCount_;
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_Initialize", result );

    return result;
}